

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O3

double despot::DESPOT::WEU(VNode *vnode,double xi)

{
  QNode *pQVar1;
  VNode *this;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  pQVar1 = VNode::parent(vnode);
  this = vnode;
  while (pQVar1 != (QNode *)0x0) {
    pQVar1 = VNode::parent(this);
    this = QNode::parent(pQVar1);
    pQVar1 = VNode::parent(this);
  }
  dVar2 = VNode::upper_bound(vnode);
  dVar3 = VNode::lower_bound(vnode);
  dVar4 = VNode::Weight(vnode);
  dVar5 = VNode::upper_bound(this);
  dVar6 = VNode::lower_bound(this);
  return (dVar2 - dVar3) - dVar4 * xi * (dVar5 - dVar6);
}

Assistant:

double DESPOT::WEU(VNode* vnode, double xi) {
	VNode* root = vnode;
	while (root->parent() != NULL) {
		root = root->parent()->parent();
	}
	return Gap(vnode) - xi * vnode->Weight() * Gap(root);
}